

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O3

void vault_objects(chunk_conflict *c,loc_conflict grid,wchar_t depth,wchar_t num)

{
  bool bVar1;
  loc grid_00;
  _Bool _Var2;
  uint32_t uVar3;
  int iVar4;
  loc_conflict near;
  loc local_38;
  
  if (L'\0' < num) {
    do {
      iVar4 = 0xb;
      do {
        _Var2 = find_nearby_grid(c,(loc_conflict *)&local_38,grid,L'\x02',L'\x03');
        grid_00 = local_38;
        if (!_Var2) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-util.c"
                        ,0x36c,"void vault_objects(struct chunk *, struct loc, int, int)");
        }
        _Var2 = square_canputitem(c,local_38);
        if (_Var2) {
          uVar3 = Rand_div(100);
          if ((int)uVar3 < 0x4b) {
            place_object(c,(loc_conflict)grid_00,depth,false,false,'\x03',L'\0');
          }
          else {
            place_gold(c,(loc_conflict)grid_00,depth,'\x05');
          }
          break;
        }
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      bVar1 = L'\x01' < num;
      num = num + L'\xffffffff';
    } while (bVar1);
  }
  return;
}

Assistant:

void vault_objects(struct chunk *c, struct loc grid, int depth, int num)
{
	int i;

	/* Attempt to place 'num' objects */
	for (; num > 0; --num) {
		/* Try up to 11 spots looking for empty space */
		for (i = 0; i < 11; ++i) {
			struct loc near;

			/* Pick a random location */
			if (!find_nearby_grid(c, &near, grid, 2, 3)) assert(0);

			/* Require "clean" floor space */
			if (!square_canputitem(c, near)) continue;

			/* Place an item or gold */
			if (randint0(100) < 75)
				place_object(c, near, depth, false, false, ORIGIN_SPECIAL, 0);
			else
				place_gold(c, near, depth, ORIGIN_VAULT);

			/* Placement accomplished */
			break;
		}
	}
}